

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeRowSingleton
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *row,int *i)

{
  uint *puVar1;
  double a;
  bool bVar2;
  undefined1 uVar3;
  int _j;
  int iVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  undefined4 uVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  pointer pnVar9;
  pointer pnVar10;
  undefined8 uVar11;
  int *piVar12;
  char cVar13;
  int iVar14;
  undefined8 uVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  RowSingletonPS *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *b;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  cpp_dec_float<100U,_int,_void> *pcVar21;
  bool strictLo;
  long in_FS_OFFSET;
  double a_00;
  bool local_b00;
  fpclass_type local_af8;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  fpclass_type local_a90;
  element_type *local_a58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a50;
  uint local_a48 [11];
  undefined3 uStack_a1b;
  int iStack_a18;
  char cStack_a14;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a10;
  element_type *local_a08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a00;
  uint local_9f8 [11];
  undefined3 uStack_9cb;
  int iStack_9c8;
  char cStack_9c4;
  undefined8 local_9c0;
  element_type *local_9b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_9b0;
  uint local_9a8 [2];
  uint auStack_9a0 [2];
  uint local_998 [2];
  uint auStack_990 [2];
  uint local_988 [2];
  uint auStack_980 [2];
  int local_978;
  bool local_974;
  fpclass_type local_970;
  int32_t iStack_96c;
  shared_ptr<soplex::Tolerances> local_968;
  undefined1 local_958 [8];
  undefined8 uStack_950;
  uint local_948 [11];
  undefined3 uStack_91b;
  int iStack_918;
  bool bStack_914;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_910;
  fpclass_type local_908;
  int32_t iStack_904;
  undefined8 uStack_900;
  uint local_8f8 [2];
  uint auStack_8f0 [2];
  uint local_8e8 [2];
  uint auStack_8e0 [2];
  uint local_8d8 [2];
  uint auStack_8d0 [2];
  uint local_8c8 [2];
  uint auStack_8c0 [2];
  element_type *local_8b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_8b0;
  uint local_8a8 [2];
  uint auStack_8a0 [2];
  uint local_898 [2];
  uint auStack_890 [2];
  uint local_888 [2];
  uint uStack_880;
  undefined3 uStack_87b;
  uint local_878 [2];
  uint auStack_870 [2];
  uint local_868 [2];
  uint auStack_860 [2];
  uint local_858 [2];
  uint auStack_850 [2];
  uint local_848 [2];
  uint auStack_840 [2];
  element_type *local_838;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_830;
  uint local_828 [2];
  uint auStack_820 [2];
  uint local_818 [2];
  uint auStack_810 [2];
  uint local_808 [2];
  uint uStack_800;
  undefined3 uStack_7fb;
  uint local_7f8 [2];
  uint auStack_7f0 [2];
  uint local_7e8 [2];
  uint auStack_7e0 [2];
  uint local_7d8 [2];
  uint auStack_7d0 [2];
  uint local_7c8 [2];
  uint auStack_7c0 [2];
  uint local_7b8 [2];
  uint auStack_7b0 [2];
  uint local_7a8 [2];
  uint auStack_7a0 [2];
  uint local_798 [2];
  uint auStack_790 [2];
  uint local_788 [2];
  uint auStack_780 [2];
  element_type *local_778;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_770;
  uint local_768 [2];
  uint auStack_760 [2];
  uint local_758 [2];
  uint auStack_750 [2];
  uint local_748 [2];
  uint uStack_740;
  undefined3 uStack_73b;
  element_type *local_738;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_730;
  uint local_728 [2];
  uint auStack_720 [2];
  uint local_718 [2];
  uint auStack_710 [2];
  uint local_708 [2];
  uint uStack_700;
  undefined3 uStack_6fb;
  element_type *local_6f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  element_type *local_6b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6b0;
  uint local_6a8 [2];
  uint auStack_6a0 [2];
  uint local_698 [2];
  uint auStack_690 [2];
  uint local_688 [2];
  uint auStack_680 [2];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_628;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  cpp_dec_float<100U,_int,_void> local_4e8;
  cpp_dec_float<100U,_int,_void> local_498;
  cpp_dec_float<100U,_int,_void> local_448;
  cpp_dec_float<100U,_int,_void> local_3f8;
  cpp_dec_float<100U,_int,_void> local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  cpp_dec_float<100U,_int,_void> local_308;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined5 uStack_280;
  undefined3 uStack_27b;
  undefined5 uStack_278;
  undefined8 local_270;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined5 uStack_1e0;
  undefined3 uStack_1db;
  undefined5 uStack_1d8;
  undefined4 local_1d0;
  undefined4 local_1cc;
  element_type *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1c0;
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198 [2];
  uint auStack_190 [2];
  int local_188;
  bool local_184;
  fpclass_type local_180;
  int32_t iStack_17c;
  cpp_dec_float<100U,_int,_void> local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  pNVar8 = row->m_elem;
  local_9b8 = *(element_type **)(pNVar8->val).m_backend.data._M_elems;
  p_Stack_9b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((pNVar8->val).m_backend.data._M_elems + 2);
  local_9a8 = *(uint (*) [2])((pNVar8->val).m_backend.data._M_elems + 4);
  auStack_9a0 = *(uint (*) [2])((pNVar8->val).m_backend.data._M_elems + 6);
  local_998 = *(uint (*) [2])((pNVar8->val).m_backend.data._M_elems + 8);
  auStack_990 = *(uint (*) [2])((pNVar8->val).m_backend.data._M_elems + 10);
  local_988 = *(uint (*) [2])((pNVar8->val).m_backend.data._M_elems + 0xc);
  auStack_980 = *(uint (*) [2])((pNVar8->val).m_backend.data._M_elems + 0xe);
  local_978 = (pNVar8->val).m_backend.exp;
  local_974 = (pNVar8->val).m_backend.neg;
  local_970 = (pNVar8->val).m_backend.fpclass;
  iStack_96c = (pNVar8->val).m_backend.prec_elem;
  _j = pNVar8->idx;
  lVar19 = (long)_j;
  ::soplex::infinity::__tls_init();
  a = *(double *)(in_FS_OFFSET + -8);
  a_00 = -a;
  local_9c0._0_4_ = cpp_dec_float_finite;
  local_9c0._4_4_ = 0x10;
  local_a08 = (element_type *)0x0;
  p_Stack_a00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9f8[0] = 0;
  local_9f8[1] = 0;
  local_9f8[2] = 0;
  local_9f8[3] = 0;
  local_9f8[4] = 0;
  local_9f8[5] = 0;
  local_9f8[6] = 0;
  local_9f8[7] = 0;
  local_9f8[8] = 0;
  local_9f8[9] = 0;
  stack0xfffffffffffff630 = 0;
  uStack_9cb = 0;
  iStack_9c8 = 0;
  cStack_9c4 = '\0';
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_a08,a_00);
  ::soplex::infinity::__tls_init();
  local_a10 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)0x1000000000;
  local_a58 = (element_type *)0x0;
  p_Stack_a50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a48[0] = 0;
  local_a48[1] = 0;
  local_a48[2] = 0;
  local_a48[3] = 0;
  local_a48[4] = 0;
  local_a48[5] = 0;
  local_a48[6] = 0;
  local_a48[7] = 0;
  local_a48[8] = 0;
  local_a48[9] = 0;
  stack0xfffffffffffff5e0 = 0;
  uStack_a1b = 0;
  iStack_a18 = 0;
  cStack_a14 = '\0';
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_a58,a);
  uVar11 = _local_970;
  local_6b8 = local_9b8;
  p_Stack_6b0 = p_Stack_9b0;
  local_6a8[0] = local_9a8[0];
  local_6a8[1] = local_9a8[1];
  auStack_6a0[0] = auStack_9a0[0];
  auStack_6a0[1] = auStack_9a0[1];
  local_698[0] = local_998[0];
  local_698[1] = local_998[1];
  auStack_690[0] = auStack_990[0];
  auStack_690[1] = auStack_990[1];
  local_688[0] = local_988[0];
  local_688[1] = local_988[1];
  auStack_680[0] = auStack_980[0];
  auStack_680[1] = auStack_980[1];
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 0x10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems[6] = 0;
  local_178.data._M_elems[7] = 0;
  local_178.data._M_elems[8] = 0;
  local_178.data._M_elems[9] = 0;
  local_178.data._M_elems[10] = 0;
  local_178.data._M_elems[0xb] = 0;
  local_178.data._M_elems[0xc] = 0;
  local_178.data._M_elems[0xd] = 0;
  local_178.data._M_elems._56_5_ = 0;
  local_178.data._M_elems[0xf]._1_3_ = 0;
  local_178.exp = 0;
  local_178.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_178,0.0);
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_3a8,this);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_6b8;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Stack_6b0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
            ((cpp_dec_float<100U,_int,_void> *)&ptr,&local_178);
  local_a90 = (fpclass_type)uVar11;
  if (((local_a90 == cpp_dec_float_NaN) || (local_3a8.fpclass == cpp_dec_float_NaN)) ||
     (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         ((cpp_dec_float<100U,_int,_void> *)&ptr,&local_3a8), iVar17 < 1)) {
    local_198[0] = local_988[0];
    local_198[1] = local_988[1];
    auStack_190[0] = auStack_980[0];
    auStack_190[1] = auStack_980[1];
    local_1a8[0] = local_998[0];
    local_1a8[1] = local_998[1];
    auStack_1a0[0] = auStack_990[0];
    auStack_1a0[1] = auStack_990[1];
    local_1b8[0] = local_9a8[0];
    local_1b8[1] = local_9a8[1];
    auStack_1b0[0] = auStack_9a0[0];
    auStack_1b0[1] = auStack_9a0[1];
    local_1c8 = local_9b8;
    p_Stack_1c0 = p_Stack_9b0;
    local_188 = local_978;
    local_184 = local_974;
    local_180 = local_970;
    iStack_17c = iStack_96c;
    local_1d0 = 0;
    local_218 = 0;
    uStack_210 = 0;
    local_208 = 0;
    uStack_200 = 0;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    uStack_1db = 0;
    uStack_1d8 = 0;
    local_1cc = 0x10;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_218,0.0);
    epsZero(&local_80,this);
    bVar16 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1c8,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_218,&local_80);
    if (!bVar16) {
      iVar17 = *i;
      pnVar9 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[iVar17].m_backend.data;
      local_268.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar9[iVar17].m_backend.data._M_elems + 2);
      puVar1 = pnVar9[iVar17].m_backend.data._M_elems + 4;
      local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = pnVar9[iVar17].m_backend.data._M_elems + 8;
      local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_268.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = pnVar9[iVar17].m_backend.data._M_elems + 0xc;
      local_268.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_268.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_268.m_backend.exp = pnVar9[iVar17].m_backend.exp;
      local_268.m_backend.neg = pnVar9[iVar17].m_backend.neg;
      local_268.m_backend.fpclass = pnVar9[iVar17].m_backend.fpclass;
      local_268.m_backend.prec_elem = pnVar9[iVar17].m_backend.prec_elem;
      local_270 = 0x1000000000;
      local_2b8 = 0;
      uStack_2b0 = 0;
      local_2a8 = 0;
      uStack_2a0 = 0;
      local_298 = 0;
      uStack_290 = 0;
      local_288 = 0;
      uStack_280 = 0;
      uStack_27b = 0;
      uStack_278 = 0;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_2b8,0.0);
      feastol(&local_d0,this);
      bVar16 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_268,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_2b8,&local_d0);
      if (bVar16) {
        return INFEASIBLE;
      }
      iVar17 = *i;
      pnVar9 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_6f8 = *(element_type **)&pnVar9[iVar17].m_backend.data;
      p_Stack_6f0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     (pnVar9[iVar17].m_backend.data._M_elems + 2);
      puVar1 = pnVar9[iVar17].m_backend.data._M_elems + 4;
      local_6e8 = *(undefined8 *)puVar1;
      uStack_6e0 = *(undefined8 *)(puVar1 + 2);
      puVar1 = pnVar9[iVar17].m_backend.data._M_elems + 8;
      local_6d8 = *(undefined8 *)puVar1;
      uStack_6d0 = *(undefined8 *)(puVar1 + 2);
      puVar1 = pnVar9[iVar17].m_backend.data._M_elems + 0xc;
      local_6c8 = *(undefined8 *)puVar1;
      uStack_6c0 = *(undefined8 *)(puVar1 + 2);
      uVar7 = pnVar9[iVar17].m_backend.fpclass;
      local_308.fpclass = cpp_dec_float_finite;
      local_308.prec_elem = 0x10;
      local_308.data._M_elems[0] = 0;
      local_308.data._M_elems[1] = 0;
      local_308.data._M_elems[2] = 0;
      local_308.data._M_elems[3] = 0;
      local_308.data._M_elems[4] = 0;
      local_308.data._M_elems[5] = 0;
      local_308.data._M_elems[6] = 0;
      local_308.data._M_elems[7] = 0;
      local_308.data._M_elems[8] = 0;
      local_308.data._M_elems[9] = 0;
      local_308.data._M_elems[10] = 0;
      local_308.data._M_elems[0xb] = 0;
      local_308.data._M_elems[0xc] = 0;
      local_308.data._M_elems[0xd] = 0;
      local_308.data._M_elems._56_5_ = 0;
      local_308.data._M_elems[0xf]._1_3_ = 0;
      local_308.exp = 0;
      local_308.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_308,0.0);
      feastol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_3f8,this);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_6f8;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Stack_6f0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                ((cpp_dec_float<100U,_int,_void> *)&ptr,&local_308);
      if (((uVar7 != cpp_dec_float_NaN) && (local_3f8.fpclass != cpp_dec_float_NaN)) &&
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             ((cpp_dec_float<100U,_int,_void> *)&ptr,&local_3f8), 0 < iVar17)) {
        return INFEASIBLE;
      }
      goto LAB_00424422;
    }
    pcVar21 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
    ::soplex::infinity::__tls_init();
    local_910 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x1000000000;
    local_958._0_4_ = 0;
    local_958._4_4_ = 0;
    uStack_950._0_4_ = 0;
    uStack_950._4_4_ = 0;
    local_948[0] = 0;
    local_948[1] = 0;
    local_948[2] = 0;
    local_948[3] = 0;
    local_948[4] = 0;
    local_948[5] = 0;
    local_948[6] = 0;
    local_948[7] = 0;
    local_948[8] = 0;
    local_948[9] = 0;
    stack0xfffffffffffff6e0 = 0;
    uStack_91b = 0;
    iStack_918 = 0;
    bStack_914 = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_958,a);
    if (((pcVar21->fpclass == cpp_dec_float_NaN) || ((fpclass_type)local_910 == cpp_dec_float_NaN))
       || (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_958), iVar17 < 0)) {
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)&ptr,
                 &(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*i].m_backend,
                 (cpp_dec_float<100U,_int,_void> *)&local_9b8);
    }
    else {
      ::soplex::infinity::__tls_init();
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&ptr,a_00);
    }
    local_9f8[8] = 0;
    local_9f8[9] = 0;
    stack0xfffffffffffff630 = 0;
    uStack_9cb = 0;
    local_9f8[4] = 0;
    local_9f8[5] = 0;
    local_9f8[6] = 0;
    local_9f8[7] = 0;
    local_9f8[0] = 0;
    local_9f8[1] = 0;
    local_9f8[2] = 0;
    local_9f8[3] = 0;
    local_a08 = ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    p_Stack_a00 = ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    iStack_9c8 = 0;
    cStack_9c4 = '\0';
    local_9c0._0_4_ = cpp_dec_float_finite;
    local_9c0._4_4_ = 0x10;
    pcVar21 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
    ::soplex::infinity::__tls_init();
    local_910 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x1000000000;
    local_958._0_4_ = 0;
    local_958._4_4_ = 0;
    uStack_950._0_4_ = 0;
    uStack_950._4_4_ = 0;
    local_948[0] = 0;
    local_948[1] = 0;
    local_948[2] = 0;
    local_948[3] = 0;
    local_948[4] = 0;
    local_948[5] = 0;
    local_948[6] = 0;
    local_948[7] = 0;
    local_948[8] = 0;
    local_948[9] = 0;
    stack0xfffffffffffff6e0 = 0;
    uStack_91b = 0;
    iStack_918 = 0;
    bStack_914 = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_958,a_00);
    if (((pcVar21->fpclass == cpp_dec_float_NaN) || ((fpclass_type)local_910 == cpp_dec_float_NaN))
       || (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_958), 0 < iVar17)) {
      pcVar21 = &(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
      goto LAB_0042434a;
    }
LAB_00424390:
    ::soplex::infinity::__tls_init();
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&ptr,a);
  }
  else {
    pcVar21 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
    ::soplex::infinity::__tls_init();
    local_910 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x1000000000;
    local_958._0_4_ = 0;
    local_958._4_4_ = 0;
    uStack_950._0_4_ = 0;
    uStack_950._4_4_ = 0;
    local_948[0] = 0;
    local_948[1] = 0;
    local_948[2] = 0;
    local_948[3] = 0;
    local_948[4] = 0;
    local_948[5] = 0;
    local_948[6] = 0;
    local_948[7] = 0;
    local_948[8] = 0;
    local_948[9] = 0;
    stack0xfffffffffffff6e0 = 0;
    uStack_91b = 0;
    iStack_918 = 0;
    bStack_914 = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_958,a_00);
    if (((pcVar21->fpclass == cpp_dec_float_NaN) || ((fpclass_type)local_910 == cpp_dec_float_NaN))
       || (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_958), 0 < iVar17)) {
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)&ptr,
                 &(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*i].m_backend,
                 (cpp_dec_float<100U,_int,_void> *)&local_9b8);
    }
    else {
      ::soplex::infinity::__tls_init();
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&ptr,a_00);
    }
    local_9f8[8] = 0;
    local_9f8[9] = 0;
    stack0xfffffffffffff630 = 0;
    uStack_9cb = 0;
    local_9f8[4] = 0;
    local_9f8[5] = 0;
    local_9f8[6] = 0;
    local_9f8[7] = 0;
    local_9f8[0] = 0;
    local_9f8[1] = 0;
    local_9f8[2] = 0;
    local_9f8[3] = 0;
    local_a08 = ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    p_Stack_a00 = ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    iStack_9c8 = 0;
    cStack_9c4 = '\0';
    local_9c0._0_4_ = cpp_dec_float_finite;
    local_9c0._4_4_ = 0x10;
    pcVar21 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
    ::soplex::infinity::__tls_init();
    local_910 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x1000000000;
    local_958._0_4_ = 0;
    local_958._4_4_ = 0;
    uStack_950._0_4_ = 0;
    uStack_950._4_4_ = 0;
    local_948[0] = 0;
    local_948[1] = 0;
    local_948[2] = 0;
    local_948[3] = 0;
    local_948[4] = 0;
    local_948[5] = 0;
    local_948[6] = 0;
    local_948[7] = 0;
    local_948[8] = 0;
    local_948[9] = 0;
    stack0xfffffffffffff6e0 = 0;
    uStack_91b = 0;
    iStack_918 = 0;
    bStack_914 = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_958,a);
    if (((pcVar21->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_910 != cpp_dec_float_NaN))
       && (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_958), -1 < iVar17))
    goto LAB_00424390;
    pcVar21 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
LAB_0042434a:
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)&ptr,pcVar21,
               (cpp_dec_float<100U,_int,_void> *)&local_9b8);
  }
  local_a48[8] = 0;
  local_a48[9] = 0;
  stack0xfffffffffffff5e0 = 0;
  uStack_a1b = 0;
  local_a48[4] = 0;
  local_a48[5] = 0;
  local_a48[6] = 0;
  local_a48[7] = 0;
  local_a48[0] = 0;
  local_a48[1] = 0;
  local_a48[2] = 0;
  local_a48[3] = 0;
  local_a58 = ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  p_Stack_a50 = ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  iStack_a18 = 0;
  cStack_a14 = '\0';
  local_a10 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)0x1000000000;
LAB_00424422:
  uVar11 = local_9c0;
  _uStack_700 = stack0xfffffffffffff630;
  uStack_6fb = uStack_9cb;
  local_708[0] = local_9f8[8];
  local_708[1] = local_9f8[9];
  local_718[0] = local_9f8[4];
  local_718[1] = local_9f8[5];
  auStack_710[0] = local_9f8[6];
  auStack_710[1] = local_9f8[7];
  local_728[0] = local_9f8[0];
  local_728[1] = local_9f8[1];
  auStack_720[0] = local_9f8[2];
  auStack_720[1] = local_9f8[3];
  local_738 = local_a08;
  p_Stack_730 = p_Stack_a00;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_448,this);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_738;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Stack_730;
  local_af8 = (fpclass_type)uVar11;
  if (((local_af8 != cpp_dec_float_NaN) && (local_448.fpclass != cpp_dec_float_NaN)) &&
     (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         ((cpp_dec_float<100U,_int,_void> *)&ptr,&local_448), iVar17 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_a08,0.0);
  }
  pnVar20 = local_a10;
  _uStack_740 = stack0xfffffffffffff5e0;
  uStack_73b = uStack_a1b;
  local_748[0] = local_a48[8];
  local_748[1] = local_a48[9];
  local_758[0] = local_a48[4];
  local_758[1] = local_a48[5];
  auStack_750[0] = local_a48[6];
  auStack_750[1] = local_a48[7];
  local_768[0] = local_a48[0];
  local_768[1] = local_a48[1];
  auStack_760[0] = local_a48[2];
  auStack_760[1] = local_a48[3];
  local_778 = local_a58;
  p_Stack_770 = p_Stack_a50;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_498,this);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_778;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Stack_770;
  local_af8 = (fpclass_type)pnVar20;
  if (((local_af8 != 2) && (local_498.fpclass != cpp_dec_float_NaN)) &&
     (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         ((cpp_dec_float<100U,_int,_void> *)&ptr,&local_498), iVar17 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_a58,0.0);
  }
  pnVar20 = local_a10;
  cVar13 = cStack_a14;
  iVar18 = iStack_a18;
  pnVar9 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar10 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).up.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_7b8 = pnVar9[lVar19].m_backend.data._M_elems[0];
  auStack_7b0 = *(uint (*) [2])(pnVar9[lVar19].m_backend.data._M_elems + 2);
  puVar1 = pnVar9[lVar19].m_backend.data._M_elems + 4;
  local_7a8 = *(uint (*) [2])puVar1;
  auStack_7a0 = *(uint (*) [2])(puVar1 + 2);
  puVar1 = pnVar9[lVar19].m_backend.data._M_elems + 8;
  local_798 = *(uint (*) [2])puVar1;
  auStack_790 = *(uint (*) [2])(puVar1 + 2);
  puVar1 = pnVar9[lVar19].m_backend.data._M_elems + 0xc;
  local_788 = *(uint (*) [2])puVar1;
  auStack_780 = *(uint (*) [2])(puVar1 + 2);
  iVar17 = pnVar9[lVar19].m_backend.exp;
  bVar16 = pnVar9[lVar19].m_backend.neg;
  local_908 = pnVar9[lVar19].m_backend.fpclass;
  iStack_904 = pnVar9[lVar19].m_backend.prec_elem;
  uStack_900 = 0;
  local_7f8 = pnVar10[lVar19].m_backend.data._M_elems[0];
  auStack_7f0 = *(uint (*) [2])(pnVar10[lVar19].m_backend.data._M_elems + 2);
  puVar1 = pnVar10[lVar19].m_backend.data._M_elems + 4;
  local_7e8 = *(uint (*) [2])puVar1;
  auStack_7e0 = *(uint (*) [2])(puVar1 + 2);
  puVar1 = pnVar10[lVar19].m_backend.data._M_elems + 8;
  local_7d8 = *(uint (*) [2])puVar1;
  auStack_7d0 = *(uint (*) [2])(puVar1 + 2);
  puVar1 = pnVar10[lVar19].m_backend.data._M_elems + 0xc;
  local_7c8 = *(uint (*) [2])puVar1;
  auStack_7c0 = *(uint (*) [2])(puVar1 + 2);
  iVar4 = pnVar10[lVar19].m_backend.exp;
  bVar2 = pnVar10[lVar19].m_backend.neg;
  fVar5 = pnVar10[lVar19].m_backend.fpclass;
  iVar6 = pnVar10[lVar19].m_backend.prec_elem;
  _uStack_800 = stack0xfffffffffffff5e0;
  uStack_7fb = uStack_a1b;
  local_808[0] = local_a48[8];
  local_808[1] = local_a48[9];
  local_818[0] = local_a48[4];
  local_818[1] = local_a48[5];
  auStack_810[0] = local_a48[6];
  auStack_810[1] = local_a48[7];
  local_828[0] = local_a48[0];
  local_828[1] = local_a48[1];
  auStack_820[0] = local_a48[2];
  auStack_820[1] = local_a48[3];
  local_838 = local_a58;
  p_Stack_830 = p_Stack_a50;
  local_878 = pnVar10[lVar19].m_backend.data._M_elems[0];
  auStack_870 = *(uint (*) [2])(pnVar10[lVar19].m_backend.data._M_elems + 2);
  puVar1 = pnVar10[lVar19].m_backend.data._M_elems + 4;
  local_868 = *(uint (*) [2])puVar1;
  auStack_860 = *(uint (*) [2])(puVar1 + 2);
  puVar1 = pnVar10[lVar19].m_backend.data._M_elems + 8;
  local_858 = *(uint (*) [2])puVar1;
  auStack_850 = *(uint (*) [2])(puVar1 + 2);
  puVar1 = pnVar10[lVar19].m_backend.data._M_elems + 0xc;
  local_848 = *(uint (*) [2])puVar1;
  auStack_840 = *(uint (*) [2])(puVar1 + 2);
  b = local_a10;
  feastol(&local_120,this);
  local_958 = (undefined1  [8])local_838;
  uStack_950 = p_Stack_830;
  local_948[0] = local_828[0];
  local_948[1] = local_828[1];
  local_948[2] = auStack_820[0];
  local_948[3] = auStack_820[1];
  local_948[4] = local_818[0];
  local_948[5] = local_818[1];
  local_948[6] = auStack_810[0];
  local_948[7] = auStack_810[1];
  local_948[8] = local_808[0];
  local_948[9] = local_808[1];
  stack0xfffffffffffff6e0 = _uStack_800;
  uStack_91b = uStack_7fb;
  iStack_918 = iVar18;
  bStack_914 = (bool)cVar13;
  local_910 = pnVar20;
  local_358.m_backend.data._M_elems[0] = local_878[0];
  local_358.m_backend.data._M_elems[1] = local_878[1];
  local_358.m_backend.data._M_elems[2] = auStack_870[0];
  local_358.m_backend.data._M_elems[3] = auStack_870[1];
  local_358.m_backend.data._M_elems[4] = local_868[0];
  local_358.m_backend.data._M_elems[5] = local_868[1];
  local_358.m_backend.data._M_elems[6] = auStack_860[0];
  local_358.m_backend.data._M_elems[7] = auStack_860[1];
  local_358.m_backend.data._M_elems[8] = local_858[0];
  local_358.m_backend.data._M_elems[9] = local_858[1];
  local_358.m_backend.data._M_elems[10] = auStack_850[0];
  local_358.m_backend.data._M_elems[0xb] = auStack_850[1];
  local_358.m_backend.data._M_elems[0xc] = local_848[0];
  local_358.m_backend.data._M_elems[0xd] = local_848[1];
  local_358.m_backend.data._M_elems[0xe] = auStack_840[0];
  local_358.m_backend.data._M_elems[0xf] = auStack_840[1];
  local_358.m_backend.prec_elem = iVar6;
  local_358.m_backend.fpclass = fVar5;
  local_358.m_backend.exp = iVar4;
  local_358.m_backend.neg = bVar2;
  relDiff<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&ptr,(soplex *)local_958,&local_358,b);
  result_6.m_backend.data._M_elems[0] = local_120.m_backend.data._M_elems[0];
  result_6.m_backend.data._M_elems[1] = local_120.m_backend.data._M_elems[1];
  uVar11 = result_6.m_backend.data._M_elems._0_8_;
  result_6.m_backend.data._M_elems[2] = local_120.m_backend.data._M_elems[2];
  result_6.m_backend.data._M_elems[3] = local_120.m_backend.data._M_elems[3];
  result_6.m_backend.data._M_elems[0xc] = local_120.m_backend.data._M_elems[0xc];
  result_6.m_backend.data._M_elems[0xd] = local_120.m_backend.data._M_elems[0xd];
  result_6.m_backend.data._M_elems[0xe] = local_120.m_backend.data._M_elems[0xe];
  result_6.m_backend.data._M_elems[0xf] = local_120.m_backend.data._M_elems[0xf];
  result_6.m_backend.data._M_elems[8] = local_120.m_backend.data._M_elems[8];
  result_6.m_backend.data._M_elems[9] = local_120.m_backend.data._M_elems[9];
  result_6.m_backend.data._M_elems[10] = local_120.m_backend.data._M_elems[10];
  result_6.m_backend.data._M_elems[0xb] = local_120.m_backend.data._M_elems[0xb];
  result_6.m_backend.data._M_elems[4] = local_120.m_backend.data._M_elems[4];
  result_6.m_backend.data._M_elems[5] = local_120.m_backend.data._M_elems[5];
  result_6.m_backend.data._M_elems[6] = local_120.m_backend.data._M_elems[6];
  result_6.m_backend.data._M_elems[7] = local_120.m_backend.data._M_elems[7];
  result_6.m_backend.exp = local_120.m_backend.exp;
  result_6.m_backend.neg = local_120.m_backend.neg;
  result_6.m_backend.fpclass = local_120.m_backend.fpclass;
  result_6.m_backend.prec_elem = local_120.m_backend.prec_elem;
  result_6.m_backend.data._M_elems[0] = local_120.m_backend.data._M_elems[0];
  if (result_6.m_backend.data._M_elems[0] != 0 ||
      local_120.m_backend.fpclass != cpp_dec_float_finite) {
    result_6.m_backend.neg = (bool)(local_120.m_backend.neg ^ 1);
  }
  result_6.m_backend.data._M_elems._0_8_ = uVar11;
  if ((local_120.m_backend.fpclass == cpp_dec_float_NaN) || (local_af8 == 2)) {
    local_b00 = false;
  }
  else {
    iVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       ((cpp_dec_float<100U,_int,_void> *)&ptr,&result_6.m_backend);
    if (iVar18 < 1) {
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2d])(lp,lVar19,&local_a58,0);
      local_b00 = true;
    }
    else {
      local_b00 = false;
    }
  }
  uVar15 = local_9c0;
  cVar13 = cStack_9c4;
  iVar14 = iStack_9c8;
  _uStack_880 = stack0xfffffffffffff630;
  uStack_87b = uStack_9cb;
  local_888[0] = local_9f8[8];
  local_888[1] = local_9f8[9];
  local_898[0] = local_9f8[4];
  local_898[1] = local_9f8[5];
  auStack_890[0] = local_9f8[6];
  auStack_890[1] = local_9f8[7];
  local_8a8[0] = local_9f8[0];
  local_8a8[1] = local_9f8[1];
  auStack_8a0[0] = local_9f8[2];
  auStack_8a0[1] = local_9f8[3];
  local_8b8 = local_a08;
  p_Stack_8b0 = p_Stack_a00;
  pnVar9 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(lVar19 * 0x50);
  puVar1 = (uint *)((long)(pnVar20->m_backend).data._M_elems + (long)pnVar9);
  local_8f8 = *(uint (*) [2])puVar1;
  auStack_8f0 = *(uint (*) [2])(puVar1 + 2);
  puVar1 = (uint *)((long)(pnVar20->m_backend).data._M_elems +
                   (long)((pnVar9->m_backend).data._M_elems + 4));
  local_8e8 = *(uint (*) [2])puVar1;
  auStack_8e0 = *(uint (*) [2])(puVar1 + 2);
  puVar1 = (uint *)((long)(pnVar20->m_backend).data._M_elems +
                   (long)((pnVar9->m_backend).data._M_elems + 8));
  local_8d8 = *(uint (*) [2])puVar1;
  auStack_8d0 = *(uint (*) [2])(puVar1 + 2);
  puVar1 = (uint *)((long)(pnVar20->m_backend).data._M_elems +
                   (long)((pnVar9->m_backend).data._M_elems + 0xc));
  local_8c8 = *(uint (*) [2])puVar1;
  auStack_8c0 = *(uint (*) [2])(puVar1 + 2);
  iVar18 = *(int *)((long)(&(pnVar20->m_backend).data + 1) + (long)pnVar9);
  uVar3 = *(undefined1 *)
           ((long)(&(pnVar20->m_backend).data + 1) + (long)((pnVar9->m_backend).data._M_elems + 1));
  uVar11 = *(undefined8 *)
            ((long)(&(pnVar20->m_backend).data + 1) + (long)((pnVar9->m_backend).data._M_elems + 2))
  ;
  feastol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_4e8,this);
  local_958 = (undefined1  [8])local_8b8;
  uStack_950 = p_Stack_8b0;
  local_948[0] = local_8a8[0];
  local_948[1] = local_8a8[1];
  local_948[2] = auStack_8a0[0];
  local_948[3] = auStack_8a0[1];
  local_948[4] = local_898[0];
  local_948[5] = local_898[1];
  local_948[6] = auStack_890[0];
  local_948[7] = auStack_890[1];
  local_948[8] = local_888[0];
  local_948[9] = local_888[1];
  stack0xfffffffffffff6e0 = _uStack_880;
  uStack_91b = uStack_87b;
  iStack_918 = iVar14;
  bStack_914 = (bool)cVar13;
  local_910 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)uVar15;
  local_358.m_backend.data._M_elems[0] = local_8f8[0];
  local_358.m_backend.data._M_elems[1] = local_8f8[1];
  local_358.m_backend.data._M_elems[2] = auStack_8f0[0];
  local_358.m_backend.data._M_elems[3] = auStack_8f0[1];
  local_358.m_backend.data._M_elems[4] = local_8e8[0];
  local_358.m_backend.data._M_elems[5] = local_8e8[1];
  local_358.m_backend.data._M_elems[6] = auStack_8e0[0];
  local_358.m_backend.data._M_elems[7] = auStack_8e0[1];
  local_358.m_backend.data._M_elems[8] = local_8d8[0];
  local_358.m_backend.data._M_elems[9] = local_8d8[1];
  local_358.m_backend.data._M_elems[10] = auStack_8d0[0];
  local_358.m_backend.data._M_elems[0xb] = auStack_8d0[1];
  local_358.m_backend.data._M_elems[0xc] = local_8c8[0];
  local_358.m_backend.data._M_elems[0xd] = local_8c8[1];
  local_358.m_backend.data._M_elems[0xe] = auStack_8c0[0];
  local_358.m_backend.data._M_elems[0xf] = auStack_8c0[1];
  local_358.m_backend.exp = iVar18;
  local_358.m_backend.neg = (bool)uVar3;
  local_358.m_backend._72_8_ = uVar11;
  relDiff<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&ptr,(soplex *)local_958,&local_358,pnVar20);
  if (((local_af8 == 2) || (local_4e8.fpclass == cpp_dec_float_NaN)) ||
     (iVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         ((cpp_dec_float<100U,_int,_void> *)&ptr,&local_4e8), iVar18 < 1)) {
    strictLo = false;
  }
  else {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(lp,lVar19,&local_a08,0);
    strictLo = true;
  }
  this_00 = (RowSingletonPS *)operator_new(0x2d8);
  iVar18 = *i;
  pnVar9 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_538.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[lVar19].m_backend.data;
  local_538.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar9[lVar19].m_backend.data._M_elems + 2);
  puVar1 = pnVar9[lVar19].m_backend.data._M_elems + 4;
  local_538.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_538.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = pnVar9[lVar19].m_backend.data._M_elems + 8;
  local_538.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  local_538.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = pnVar9[lVar19].m_backend.data._M_elems + 0xc;
  local_538.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  local_538.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
  local_538.m_backend.exp = pnVar9[lVar19].m_backend.exp;
  local_538.m_backend.neg = pnVar9[lVar19].m_backend.neg;
  local_538.m_backend.fpclass = pnVar9[lVar19].m_backend.fpclass;
  local_538.m_backend.prec_elem = pnVar9[lVar19].m_backend.prec_elem;
  pnVar9 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_588.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[lVar19].m_backend.data;
  local_588.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar9[lVar19].m_backend.data._M_elems + 2);
  puVar1 = pnVar9[lVar19].m_backend.data._M_elems + 4;
  local_588.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_588.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = pnVar9[lVar19].m_backend.data._M_elems + 8;
  local_588.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  local_588.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = pnVar9[lVar19].m_backend.data._M_elems + 0xc;
  local_588.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  local_588.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
  local_588.m_backend.exp = pnVar9[lVar19].m_backend.exp;
  local_588.m_backend.neg = pnVar9[lVar19].m_backend.neg;
  local_588.m_backend.fpclass = pnVar9[lVar19].m_backend.fpclass;
  local_588.m_backend.prec_elem = pnVar9[lVar19].m_backend.prec_elem;
  local_5d8.m_backend.data._M_elems[0xc] = local_788[0];
  local_5d8.m_backend.data._M_elems[0xd] = local_788[1];
  local_5d8.m_backend.data._M_elems[0xe] = auStack_780[0];
  local_5d8.m_backend.data._M_elems[0xf] = auStack_780[1];
  local_5d8.m_backend.data._M_elems[8] = local_798[0];
  local_5d8.m_backend.data._M_elems[9] = local_798[1];
  local_5d8.m_backend.data._M_elems[10] = auStack_790[0];
  local_5d8.m_backend.data._M_elems[0xb] = auStack_790[1];
  local_5d8.m_backend.data._M_elems[4] = local_7a8[0];
  local_5d8.m_backend.data._M_elems[5] = local_7a8[1];
  local_5d8.m_backend.data._M_elems[6] = auStack_7a0[0];
  local_5d8.m_backend.data._M_elems[7] = auStack_7a0[1];
  local_5d8.m_backend.data._M_elems[0] = local_7b8[0];
  local_5d8.m_backend.data._M_elems[1] = local_7b8[1];
  local_5d8.m_backend.data._M_elems[2] = auStack_7b0[0];
  local_5d8.m_backend.data._M_elems[3] = auStack_7b0[1];
  local_5d8.m_backend.fpclass = local_908;
  local_5d8.m_backend.prec_elem = iStack_904;
  local_628.m_backend.data._M_elems[0xc] = local_7c8[0];
  local_628.m_backend.data._M_elems[0xd] = local_7c8[1];
  local_628.m_backend.data._M_elems[0xe] = auStack_7c0[0];
  local_628.m_backend.data._M_elems[0xf] = auStack_7c0[1];
  local_628.m_backend.data._M_elems[8] = local_7d8[0];
  local_628.m_backend.data._M_elems[9] = local_7d8[1];
  local_628.m_backend.data._M_elems[10] = auStack_7d0[0];
  local_628.m_backend.data._M_elems[0xb] = auStack_7d0[1];
  local_628.m_backend.data._M_elems[4] = local_7e8[0];
  local_628.m_backend.data._M_elems[5] = local_7e8[1];
  local_628.m_backend.data._M_elems[6] = auStack_7e0[0];
  local_628.m_backend.data._M_elems[7] = auStack_7e0[1];
  local_628.m_backend.data._M_elems[0] = local_7f8[0];
  local_628.m_backend.data._M_elems[1] = local_7f8[1];
  local_628.m_backend.data._M_elems[2] = auStack_7f0[0];
  local_628.m_backend.data._M_elems[3] = auStack_7f0[1];
  local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_628.m_backend.exp = iVar4;
  local_628.m_backend.neg = bVar2;
  local_628.m_backend.fpclass = fVar5;
  local_628.m_backend.prec_elem = iVar6;
  local_5d8.m_backend.exp = iVar17;
  local_5d8.m_backend.neg = bVar16;
  RowSingletonPS::RowSingletonPS
            (this_00,lp,iVar18,_j,strictLo,local_b00,&local_538,&local_588,&local_5d8,&local_628,
             &local_968);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::RowSingletonPS*>
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  if (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&ptr);
  piVar12 = (this->m_rIdx).data;
  piVar12[*i] = piVar12[(long)(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum + -1];
  (*(lp->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0xf])(lp);
  piVar12 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_remRows;
  *piVar12 = *piVar12 + 1;
  piVar12 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_remNzos;
  *piVar12 = *piVar12 + 1;
  piVar12 = (this->m_stat).data + 2;
  *piVar12 = *piVar12 + 1;
  if (ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeRowSingleton(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 1);

   R aij = row.value(0);
   int  j   = row.index(0);
   R lo  = R(-infinity);
   R up  =  R(infinity);

   SPxOut::debug(this, "IMAISM22 row {}: singleton -> val={} lhs={} rhs={}", i, aij, lp.lhs(i),
                 lp.rhs(i));

   if(GT(aij, R(0.0), this->epsZero()))            // aij > 0
   {
      lo = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) / aij;
      up = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) / aij;
   }
   else if(LT(aij, R(0.0), this->epsZero()))       // aij < 0
   {
      lo = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) / aij;
      up = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) / aij;
   }
   else if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
   {
      // aij == 0, rhs < 0 or lhs > 0
      SPxOut::debug(this, " infeasible\n");
      return this->INFEASIBLE;
   }

   if(isZero(lo, this->epsZero()))
      lo = 0.0;

   if(isZero(up, this->epsZero()))
      up = 0.0;

   SPxOut::debug(this, " removed, lower={} ({}) upper={} ({})\n", lo, lp.lower(j), up, lp.upper(j));

   bool stricterUp = false;
   bool stricterLo = false;

   R oldLo = lp.lower(j);
   R oldUp = lp.upper(j);

   if(LTrel(up, lp.upper(j), feastol()))
   {
      lp.changeUpper(j, up);
      stricterUp = true;
   }

   if(GTrel(lo, lp.lower(j), feastol()))
   {
      lp.changeLower(j, lo);
      stricterLo = true;
   }

   std::shared_ptr<PostStep> ptr(new RowSingletonPS(lp, i, j, stricterLo, stricterUp,
                                 lp.lower(j),
                                 lp.upper(j), oldLo, oldUp, this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);

   this->m_remRows++;
   this->m_remNzos++;
   ++m_stat[SINGLETON_ROW];

   return this->OKAY;
}